

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_language.cpp
# Opt level: O0

GrammarPtr __thiscall Omega_h::build_grammar(Omega_h *this,Language *language)

{
  size_t this_00;
  bool bVar1;
  reference __k;
  vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_> *pvVar2;
  uint *puVar3;
  size_type sVar4;
  mapped_type *pmVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  ostream *poVar6;
  ParserFail *this_02;
  reference ppVar7;
  reference this_03;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  GrammarPtr GVar8;
  undefined1 local_350 [24];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *pair;
  iterator __end1_3;
  iterator __begin1_3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *__range1_3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_300;
  undefined1 local_2e1;
  string local_2e0 [32];
  stringstream local_2c0 [8];
  stringstream ss;
  ostream local_2b0 [376];
  key_type *local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *lang_symb;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  Production gprod;
  Production *lang_prod;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_> *__range1_2;
  Grammar out;
  Production *production;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_> *__range1_1;
  int nsymbols;
  Token *token;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_> *__range1;
  undefined1 local_48 [4];
  int nterminals;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  symbol_map;
  Language *language_local;
  
  symbol_map._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)language;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         *)local_48);
  this_00 = symbol_map._M_t._M_impl.super__Rb_tree_header._M_node_count;
  __range1._4_4_ = 0;
  __end1 = std::vector<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>::begin
                     ((vector<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_> *
                      )symbol_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
  token = (Token *)std::vector<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
                   ::end((vector<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
                          *)this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_Omega_h::Language::Token_*,_std::vector<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>_>
                                     *)&token), bVar1) {
    __k = __gnu_cxx::
          __normal_iterator<const_Omega_h::Language::Token_*,_std::vector<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>_>
          ::operator*(&__end1);
    puVar3 = (uint *)std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                   *)local_48,&__k->name);
    in_RCX = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (ulong)__range1._4_4_;
    *puVar3 = __range1._4_4_;
    __gnu_cxx::
    __normal_iterator<const_Omega_h::Language::Token_*,_std::vector<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>_>
    ::operator++(&__end1);
    __range1._4_4_ = __range1._4_4_ + 1;
  }
  __range1_1._0_4_ = __range1._4_4_;
  pvVar2 = (vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_> *)
           (symbol_map._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x18);
  __end1_1 = std::
             vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>::
             begin(pvVar2);
  production = (Production *)
               std::
               vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
               ::end(pvVar2);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<const_Omega_h::Language::Production_*,_std::vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>_>
                             *)&production), bVar1) {
    out.symbol_names.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         &__gnu_cxx::
          __normal_iterator<const_Omega_h::Language::Production_*,_std::vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>_>
          ::operator*(&__end1_1)->lhs;
    sVar4 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     *)local_48,
                    out.symbol_names.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (sVar4 == 0) {
      puVar3 = (uint *)std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                     *)local_48,
                                    out.symbol_names.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      in_RCX = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (ulong)(uint)__range1_1;
      *puVar3 = (uint)__range1_1;
      __range1_1._0_4_ = (uint)__range1_1 + 1;
    }
    __gnu_cxx::
    __normal_iterator<const_Omega_h::Language::Production_*,_std::vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>_>
    ::operator++(&__end1_1);
  }
  Grammar::Grammar((Grammar *)&__range1_2);
  __range1_2._0_4_ = (uint)__range1_1;
  __range1_2._4_4_ = __range1._4_4_;
  pvVar2 = (vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_> *)
           (symbol_map._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x18);
  __end1_2 = std::
             vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>::
             begin(pvVar2);
  lang_prod = (Production *)
              std::
              vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
              ::end(pvVar2);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_2,
                       (__normal_iterator<const_Omega_h::Language::Production_*,_std::vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>_>
                        *)&lang_prod);
    if (!bVar1) {
      std::__cxx11::string::string((string *)&__range1_3);
      make_vector<std::__cxx11::string>
                (&local_300,(Omega_h *)(ulong)(uint)__range1_1,(int)(string *)&__range1_3,in_RCX);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&out.productions.
                      super__Vector_base<Omega_h::Grammar::Production,_std::allocator<Omega_h::Grammar::Production>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_300);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_300);
      std::__cxx11::string::~string((string *)&__range1_3);
      __end1_3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                          *)local_48);
      pair = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
              *)std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                       *)local_48);
      while (bVar1 = std::operator!=(&__end1_3,(_Self *)&pair), bVar1) {
        ppVar7 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                 ::operator*(&__end1_3);
        local_350._16_8_ = ppVar7;
        this_03 = at<std::__cxx11::string>
                            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&out.productions.
                                 super__Vector_base<Omega_h::Grammar::Production,_std::allocator<Omega_h::Grammar::Production>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,ppVar7->second);
        std::__cxx11::string::operator=((string *)this_03,(string *)ppVar7);
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
        ::operator++(&__end1_3);
      }
      add_end_terminal((Grammar *)&__range1_2);
      add_accept_production((Grammar *)&__range1_2);
      std::make_shared<Omega_h::Grammar,Omega_h::Grammar>((Grammar *)local_350);
      std::shared_ptr<Omega_h::Grammar_const>::shared_ptr<Omega_h::Grammar,void>
                ((shared_ptr<Omega_h::Grammar_const> *)this,
                 (shared_ptr<Omega_h::Grammar> *)local_350);
      std::shared_ptr<Omega_h::Grammar>::~shared_ptr((shared_ptr<Omega_h::Grammar> *)local_350);
      Grammar::~Grammar((Grammar *)&__range1_2);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              *)local_48);
      GVar8.super___shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = extraout_RDX._M_pi;
      GVar8.super___shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this;
      return (GrammarPtr)
             GVar8.super___shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2>;
    }
    gprod.rhs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)__gnu_cxx::
                  __normal_iterator<const_Omega_h::Language::Production_*,_std::vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>_>
                  ::operator*(&__end1_2);
    Grammar::Production::Production((Production *)&__range2);
    sVar4 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     *)local_48,
                    (key_type *)
                    gprod.rhs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
    if (sVar4 == 0) break;
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                           *)local_48,
                          (key_type *)
                          gprod.rhs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
    __range2._0_4_ = *pmVar5;
    this_01 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(gprod.rhs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage + 8);
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(this_01);
    lang_symb = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end(this_01);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&lang_symb), bVar1) {
      local_138 = __gnu_cxx::
                  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end2);
      sVar4 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                       *)local_48,local_138);
      if (sVar4 == 0) {
        std::__cxx11::stringstream::stringstream(local_2c0);
        poVar6 = std::operator<<(local_2b0,"RHS entry \"");
        poVar6 = std::operator<<(poVar6,(string *)local_138);
        std::operator<<(poVar6,"\" is neither a nonterminal (LHS of a production) nor a token!\n");
        local_2e1 = 1;
        this_02 = (ParserFail *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringstream::str();
        ParserFail::ParserFail(this_02,local_2e0);
        local_2e1 = 0;
        __cxa_throw(this_02,&ParserFail::typeinfo,ParserFail::~ParserFail);
      }
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                             *)local_48,local_138);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)&gprod,pmVar5);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    std::vector<Omega_h::Grammar::Production,_std::allocator<Omega_h::Grammar::Production>_>::
    emplace_back<Omega_h::Grammar::Production>
              ((vector<Omega_h::Grammar::Production,_std::allocator<Omega_h::Grammar::Production>_>
                *)&out,(Production *)&__range2);
    Grammar::Production::~Production((Production *)&__range2);
    __gnu_cxx::
    __normal_iterator<const_Omega_h::Language::Production_*,_std::vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>_>
    ::operator++(&__end1_2);
  }
  fail("assertion %s failed at %s +%d\n","symbol_map.count(lang_prod.lhs)",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_language.cpp"
       ,0x1f);
}

Assistant:

GrammarPtr build_grammar(Language const& language) {
  std::map<std::string, int> symbol_map;
  int nterminals = 0;
  for (auto& token : language.tokens) {
    symbol_map[token.name] = nterminals++;
  }
  int nsymbols = nterminals;
  for (auto& production : language.productions) {
    if (symbol_map.count(production.lhs)) continue;
    symbol_map[production.lhs] = nsymbols++;
  }
  Grammar out;
  out.nsymbols = nsymbols;
  out.nterminals = nterminals;
  for (auto& lang_prod : language.productions) {
    Grammar::Production gprod;
    OMEGA_H_CHECK(symbol_map.count(lang_prod.lhs));
    gprod.lhs = symbol_map[lang_prod.lhs];
    for (auto& lang_symb : lang_prod.rhs) {
      if (!symbol_map.count(lang_symb)) {
        std::stringstream ss;
        ss << "RHS entry \"" << lang_symb
           << "\" is neither a nonterminal (LHS of a production) nor a "
              "token!\n";
        throw ParserFail(ss.str());
      }
      gprod.rhs.push_back(symbol_map[lang_symb]);
    }
    out.productions.emplace_back(std::move(gprod));
  }
  out.symbol_names = make_vector<std::string>(nsymbols);
  for (auto& pair : symbol_map) {
    at(out.symbol_names, pair.second) = pair.first;
  }
  add_end_terminal(out);
  add_accept_production(out);
  return std::make_shared<Grammar>(std::move(out));
}